

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O0

DataType __thiscall
csv::internals::_process_potential_exponential
          (internals *this,string_view exponential_part,longdouble *coeff,longdouble *out)

{
  longdouble lVar1;
  string_view in;
  DataType DVar2;
  longdouble *n;
  longdouble in_ST0;
  undefined1 auStack_48 [4];
  DataType result;
  longdouble exponent;
  longdouble *local_30;
  longdouble *out_local;
  longdouble *coeff_local;
  string_view exponential_part_local;
  
  out_local = (longdouble *)exponential_part._M_str;
  n = (longdouble *)exponential_part._M_len;
  _auStack_48 = (longdouble)0;
  in._M_str = (char *)n;
  in._M_len = (size_t)this;
  local_30 = coeff;
  coeff_local = (longdouble *)this;
  exponential_part_local._M_len = (size_t)n;
  DVar2 = data_type(in,(longdouble *)auStack_48,'.');
  if ((DVar2 < CSV_INT8) || (CSV_BIGINT < DVar2)) {
    exponential_part_local._M_str._4_4_ = CSV_STRING;
  }
  else {
    if (local_30 != (longdouble *)0x0) {
      lVar1 = *out_local;
      pow10<long_double>((longdouble *)auStack_48,n);
      *local_30 = lVar1 * in_ST0;
    }
    exponential_part_local._M_str._4_4_ = CSV_DOUBLE;
  }
  return exponential_part_local._M_str._4_4_;
}

Assistant:

HEDLEY_PRIVATE CONSTEXPR_14
        DataType _process_potential_exponential(
            csv::string_view exponential_part,
            const long double& coeff,
            long double * const out) {
            long double exponent = 0;
            auto result = data_type(exponential_part, &exponent);

            // Exponents in scientific notation should not be decimal numbers
            if (result >= DataType::CSV_INT8 && result < DataType::CSV_DOUBLE) {
                if (out) *out = coeff * pow10(exponent);
                return DataType::CSV_DOUBLE;
            }

            return DataType::CSV_STRING;
        }